

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST_Parser.cpp
# Opt level: O3

shared_ptr<nigel::AstCondition> __thiscall
nigel::AST_Parser::splitMostRightExpr
          (AST_Parser *this,shared_ptr<nigel::AstExpr> *currLVal,
          shared_ptr<nigel::AstCombinationCondition> *cExpr,int priority)

{
  int iVar1;
  mapped_type *pmVar2;
  undefined4 in_register_0000000c;
  undefined8 *puVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  element_type *this_00;
  int in_R8D;
  element_type *this_01;
  _func_int **pp_Var5;
  shared_ptr<nigel::AstCondition> sVar6;
  undefined1 local_68 [32];
  AST_Parser *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  
  if ((((cExpr->super___shared_ptr<nigel::AstCombinationCondition,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr)->super_AstCondition).super_AstExpr.type == combinationCondition) {
    local_38 = &(cExpr->
                super___shared_ptr<nigel::AstCombinationCondition,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount;
    pp_Var5 = (_func_int **)0x0;
    this_01 = (element_type *)0x0;
    local_68._20_4_ = in_R8D;
    local_68._24_8_ = (undefined8 *)CONCAT44(in_register_0000000c,priority);
    local_48 = this;
    local_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)currLVal;
    do {
      AstExpr::as<nigel::AstCombinationCondition>((AstExpr *)local_68);
      pmVar2 = std::
               map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
               ::operator[]((map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
                             *)(currLVal + 2),(key_type *)(local_68._0_8_ + 0x50));
      iVar1 = *pmVar2;
      if ((element_type *)local_68._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
      }
      this_00 = this_01;
      if ((int)local_68._20_4_ <= iVar1) break;
      AstExpr::as<nigel::AstCombinationCondition>((AstExpr *)local_68);
      this_00 = (element_type *)local_68._8_8_;
      pp_Var5 = (_func_int **)local_68._0_8_;
      local_68._0_8_ = (_func_int **)0x0;
      local_68._8_8_ = (element_type *)0x0;
      if ((this_01 != (element_type *)0x0) &&
         (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01),
         (element_type *)local_68._8_8_ != (element_type *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
      }
      AstExpr::as<nigel::AstCombinationCondition>((AstExpr *)local_68);
      (cExpr->super___shared_ptr<nigel::AstCombinationCondition,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
           = *(element_type **)(local_68._0_8_ + 0x40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (local_38,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68._0_8_ + 0x48));
      if ((element_type *)local_68._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
      }
      this_01 = this_00;
    } while ((((cExpr->
               super___shared_ptr<nigel::AstCombinationCondition,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->super_AstCondition).super_AstExpr.type == combinationCondition);
    puVar3 = (undefined8 *)local_68._24_8_;
    currLVal = (shared_ptr<nigel::AstExpr> *)local_40._M_pi;
    this = local_48;
    if (pp_Var5 != (_func_int **)0x0) {
      pp_Var5[8] = *(_func_int **)local_68._24_8_;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(pp_Var5 + 9),
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68._24_8_ + 8));
      this = local_48;
      sVar6 = AstExpr::as<nigel::AstCondition>((AstExpr *)local_48);
      _Var4 = sVar6.super___shared_ptr<nigel::AstCondition,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
      goto LAB_00137b4f;
    }
  }
  else {
    this_00 = (element_type *)0x0;
    puVar3 = (undefined8 *)CONCAT44(in_register_0000000c,priority);
  }
  ((__shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2> *)
  &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)currLVal)[0xb]._vptr__Sp_counted_base)->_M_ptr =
       (element_type *)*puVar3;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)currLVal)[0xb]._M_use_count,
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(puVar3 + 1));
  sVar6 = AstExpr::as<nigel::AstCondition>((AstExpr *)this);
  _Var4 = sVar6.super___shared_ptr<nigel::AstCondition,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi;
LAB_00137b4f:
  if (this_00 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
    _Var4._M_pi = extraout_RDX;
  }
  sVar6.super___shared_ptr<nigel::AstCondition,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  sVar6.super___shared_ptr<nigel::AstCondition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<nigel::AstCondition>)
         sVar6.super___shared_ptr<nigel::AstCondition,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<AstCondition> AST_Parser::splitMostRightExpr( std::shared_ptr<AstExpr> currLVal, std::shared_ptr<AstCombinationCondition> cExpr, int priority )
	{
		//Check if lValue is a term
		std::shared_ptr<AstCombinationCondition> clTerm = nullptr;
		while( currLVal->type == AstExpr::Type::combinationCondition && opPriority[currLVal->as<AstCombinationCondition>()->op] < priority )
		{//Check if lTerm has to be splitted up
			clTerm = currLVal->as<AstCombinationCondition>();
			currLVal = currLVal->as<AstCombinationCondition>()->rVal;
		}

		//Test for lTerm
		if( clTerm != nullptr )
		{//Min. 1 term was splitted up
			clTerm->rVal = cExpr;
			return currLVal->as<AstCondition>();
		}
		else
		{//LValue is a atomic astExpr
			lValue = cExpr;//Set as lValue
			return currLVal->as<AstCondition>();
		}
	}